

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

void __thiscall chrono::ChSystem::AddMesh(ChSystem *this,shared_ptr<chrono::fea::ChMesh> *mesh)

{
  __shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>);
  ChAssembly::AddMesh(&this->assembly,(shared_ptr<chrono::fea::ChMesh> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void ChSystem::AddMesh(std::shared_ptr<fea::ChMesh> mesh) {
    assembly.AddMesh(mesh);
}